

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

bool __thiscall chrono::ChOptimizerGenetic::DoOptimize(ChOptimizerGenetic *this)

{
  double dVal;
  undefined4 uVar1;
  ChGenotype *pCVar2;
  ChGenotype **my_population;
  uint uVar3;
  ChLog *pCVar4;
  ChGenotype *pCVar5;
  long lVar6;
  void *__src;
  Scalar *pSVar7;
  ChOptimizerGenetic *this_00;
  char *__format;
  ulong index;
  
  pCVar4 = GetLog();
  ChStreamOutAscii::operator<<
            (&pCVar4->super_ChStreamOutAscii,"\n\n\nGENETIC OPTIMIZATION STARTED.............\n\n");
  uVar3 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])(this);
  CreatePopulation(this,&this->population,*(int *)&(this->super_ChOptimizer).field_0x144);
  InitializePopulation(this);
  this->mutants = 0;
  pCVar4 = GetLog();
  uVar1 = *(undefined4 *)&(pCVar4->super_ChStreamOutAscii).field_0x1c;
  pCVar4 = GetLog();
  *(undefined4 *)&(pCVar4->super_ChStreamOutAscii).field_0x1c = 4;
  ComputeAllFitness(this);
  lVar6 = 1;
  do {
    this->generations_done = lVar6;
    if (this->max_generations < lVar6) {
LAB_00d24187:
      pCVar4 = GetLog();
      *(undefined4 *)&(pCVar4->super_ChStreamOutAscii).field_0x1c = uVar1;
      if ((long)this->max_generations <= this->generations_done) {
        sprintf((this->super_ChOptimizer).err_message,"OK, all %d generations done");
      }
      pCVar4 = GetLog();
      ChStreamOutAscii::operator<<
                (&pCVar4->super_ChStreamOutAscii,"\n\nGENETIC OPTIMIZATION TERMINATED.");
      pCVar4 = GetLog();
      ChStreamOutAscii::operator<<
                (&pCVar4->super_ChStreamOutAscii,
                 "\nResetting the system to the best genotype-variables found:");
      __src = calloc((long)(int)uVar3,8);
      for (index = 0; (~((int)uVar3 >> 0x1f) & uVar3) != index; index = index + 1) {
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            this->best_indiv,index);
        dVal = *pSVar7;
        *(double *)((long)__src + index * 8) = dVal;
        pCVar4 = GetLog();
        ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,"\n   ");
        pCVar4 = GetLog();
        ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,dVal);
      }
      memcpy((this->super_ChOptimizer).xv,__src,(long)(int)uVar3 << 3);
      free(__src);
      pCVar4 = GetLog();
      ChStreamOutAscii::operator<<
                (&pCVar4->super_ChStreamOutAscii,
                 "\n with fitness (objective fx obtained) equal to = ");
      pCVar4 = GetLog();
      ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,this->best_indiv->fitness);
      this_00 = (ChOptimizerGenetic *)GetLog();
      ChStreamOutAscii::operator<<((ChStreamOutAscii *)this_00,"\n\n\n");
      DeletePopulation(this_00,&this->population,*(int *)&(this->super_ChOptimizer).field_0x144);
      if ((this->super_ChOptimizer).C_vars == 0) {
        free((this->super_ChOptimizer).xv_sup);
        free((this->super_ChOptimizer).xv_inf);
      }
      return true;
    }
    if ((this->crossv_change == DATE) && (this->crossv_changewhen < lVar6)) {
      this->crossover = this->crossv_changeto;
    }
    pCVar2 = this->best_indiv;
    pCVar5 = Select_best(this,this->population);
    ChGenotype::Copy(pCVar2,pCVar5);
    (this->super_ChOptimizer).opt_fx = this->best_indiv->fitness;
    PopulationStats(this,&this->average,&this->max_fitness,&this->min_fitness,&this->stdeviation);
    LogOut(this,true);
    if ((this->stop_by_stdeviation == true) && (this->stdeviation <= this->stop_stdeviation)) {
      lVar6 = this->generations_done;
      __format = "OK, imposed standard deviation reached in %ld generations";
LAB_00d24180:
      sprintf((this->super_ChOptimizer).err_message,__format,lVar6);
      goto LAB_00d24187;
    }
    if ((this->stop_by_fitness == true) && (this->stop_fitness <= this->max_fitness)) {
      lVar6 = this->generations_done;
      __format = "OK, imposed max fitness reached in %ld generations";
      goto LAB_00d24180;
    }
    if ((this->super_ChOptimizer).user_break != 0) {
      if ((this->super_ChOptimizer).err_message[0] == '\0') {
        builtin_strncpy((this->super_ChOptimizer).err_message,"OK, user break",0xf);
      }
      goto LAB_00d24187;
    }
    Crossover(this);
    Mutation(this);
    ComputeAllFitness(this);
    Selection(this);
    if (this->elite == true) {
      my_population = this->population;
      pCVar5 = Select_best(this,my_population);
      pCVar2 = this->best_indiv;
      if (pCVar5->fitness < pCVar2->fitness) {
        pCVar5 = Select_worst(this,my_population);
        ChGenotype::Copy(pCVar5,pCVar2);
      }
    }
    lVar6 = this->generations_done + 1;
  } while( true );
}

Assistant:

bool ChOptimizerGenetic::DoOptimize() {
    GetLog() << "\n\n\nGENETIC OPTIMIZATION STARTED.............\n\n";

    int nv = GetNumOfVars();

    // allocate -if needed- the upper-lower boundaries arrays
    /*
        if (!C_vars)
        {
            xv_sup = (double*) calloc (nv, sizeof(double));
            xv_inf = (double*) calloc (nv, sizeof(double));
            int mvar = 0;

            for (ChOptVar* Vovar = optvarlist; Vovar != NULL; Vovar = (ChOptVar*) Vovar->GetNext())
            {
                xv_sup[mvar] = Vovar->GetLimSup();
                xv_inf[mvar] = Vovar->GetLimInf();
                mvar++;
            }
        }
    */

    CreatePopulation(population, popsize);
    InitializePopulation();

    mutants = 0;

    // avoid complete streaming of log during optimization;
    ChLog::eChLogLevel oldfilemode = GetLog().GetCurrentLevel();
    GetLog().SetCurrentLevel(ChLog::CHQUIET);

    // -- COMPUTE FITNESS  (for all individuals of brand-new population, 1st time)
    ComputeAllFitness();

    //
    // THE CYCLE OF OPTIMIZATION,
    // GENERATION BY GENERATION
    //
    for (generations_done = 1; generations_done <= max_generations; generations_done++) {
        if (crossv_change == CrossoverChangeType::DATE)
            if (generations_done > crossv_changewhen)
                crossover = crossv_changeto;

        // -- store the best individual of old population
        best_indiv->Copy(Select_best(population));

        // -- set the value of best found value of FX
        opt_fx = best_indiv->fitness;

        // -- statistics...
        PopulationStats(average, max_fitness, min_fitness, stdeviation);

        // -- log
        LogOut(true);

        // -- break cycle conditions
        if (stop_by_stdeviation)
            if (stdeviation <= stop_stdeviation) {
                sprintf(err_message, "OK, imposed standard deviation reached in %ld generations",
                        (long)generations_done);
                break;
            }
        if (stop_by_fitness)
            if (max_fitness >= stop_fitness) {
                sprintf(err_message, "OK, imposed max fitness reached in %ld generations", (long)generations_done);
                break;
            }

        // -- user break?
        if (user_break) {
            if (*err_message == 0)
                sprintf(err_message, "OK, user break");
            break;
        }

        // -- CROSSOVER
        Crossover();

        // -- MUTATION
        Mutation();

        // -- COMPUTE FITNESS
        ComputeAllFitness();

        // -- SELECTION
        Selection();

        if (elite) {
            if (Select_best(population)->fitness < best_indiv->fitness) {
                Select_worst(population)->Copy(best_indiv);
            }
        }
    }

    GetLog().SetCurrentLevel(oldfilemode);

    if (generations_done >= max_generations)
        sprintf(err_message, "OK, all %d generations done", max_generations);

    // on termination, reset the system at the value of the fenotypes of the best indiv.

    GetLog() << "\n\nGENETIC OPTIMIZATION TERMINATED.";

    GetLog() << "\nResetting the system to the best genotype-variables found:";

    // resetting system  (or xv[] vector) to best individual
    int mvar;
    double* myvars = (double*)calloc(nv, sizeof(double));
    for (mvar = 0; mvar < nv; mvar++) {
        myvars[mvar] = best_indiv->genes(mvar);
        GetLog() << "\n   ";
        GetLog() << myvars[mvar];
    }

    memcpy(xv, myvars, (sizeof(double) * nv));
    //	Vars_to_System(myvars);

    free(myvars);  // delete the array of variables

    GetLog() << "\n with fitness (objective fx obtained) equal to = ";
    GetLog() << best_indiv->fitness;
    GetLog() << "\n\n\n";

    // delete the population, useful anymore...
    DeletePopulation(population, popsize);

    if (!C_vars) {
        free(xv_sup);
        free(xv_inf);
    }

    return true;
}